

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs12_test.cc
# Opt level: O2

void __thiscall PKCS12Test_TestNSS_Test::TestBody(PKCS12Test_TestNSS_Test *this)

{
  string data;
  Span<const_unsigned_char> local_28;
  
  GetTestData_abi_cxx11_((string *)&local_28,"crypto/pkcs8/test/nss.p12");
  TestImpl("NSS",local_28,"foo","Internet Widgits Pty Ltd");
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

TEST(PKCS12Test, TestNSS) {
  // nss.p12 is the result of importing the OpenSSL example PKCS#12 into Chrome
  // on Linux and then exporting it again.
  std::string data = GetTestData("crypto/pkcs8/test/nss.p12");
  TestImpl("NSS", bssl::StringAsBytes(data), kPassword,
           "Internet Widgits Pty Ltd");
}